

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O0

iterator * __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::begin(concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        *this)

{
  iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  *in_RSI;
  iterator *in_RDI;
  shared_ptr<std::unique_lock<tthread::fast_mutex>_> p;
  fast_mutex *in_stack_ffffffffffffffd8;
  
  std::make_shared<std::unique_lock<tthread::fast_mutex>,tthread::fast_mutex&>
            (in_stack_ffffffffffffffd8);
  std::
  map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::begin((map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           *)in_RDI);
  iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::iterator_(in_RSI,&in_RDI->it,(SharedPtr *)0x1329da);
  std::shared_ptr<std::unique_lock<tthread::fast_mutex>_>::~shared_ptr
            ((shared_ptr<std::unique_lock<tthread::fast_mutex>_> *)0x1329e6);
  return in_RDI;
}

Assistant:

iterator        begin()                 { auto p = std::make_shared<lock_guard<fast_mutex>>(mutex_); return iterator(map_.begin(), p); }